

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O2

bool anon_unknown.dwarf_d3fac3::isDereferenceOperation(TOperator op)

{
  if ((3 < op - EOpIndexDirect) && (op != EOpMatrixSwizzle)) {
    return false;
  }
  return true;
}

Assistant:

bool isDereferenceOperation(glslang::TOperator op)
{
    switch (op) {
    case glslang::EOpIndexDirect:
    case glslang::EOpIndexDirectStruct:
    case glslang::EOpIndexIndirect:
    case glslang::EOpVectorSwizzle:
    case glslang::EOpMatrixSwizzle:
        return true;
    default:
        return false;
    }
}